

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledYa.cpp
# Opt level: O2

void anon_unknown.dwarf_2b2251::wheel(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  uint16_t uVar1;
  Rgba *pRVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int x;
  ulong uVar8;
  ulong uVar9;
  half *this;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float __y;
  float fVar13;
  float fVar14;
  
  fVar3 = (float)w * 0.5;
  fVar4 = (float)h * 0.5;
  uVar10 = 0;
  uVar9 = (ulong)(uint)w;
  if (w < 1) {
    uVar9 = uVar10;
  }
  uVar6 = (ulong)(uint)h;
  if (h < 1) {
    uVar6 = uVar10;
  }
  fVar12 = fVar3;
  if (fVar4 <= fVar3) {
    fVar12 = fVar4;
  }
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    __y = (float)(int)uVar5 - fVar4;
    lVar7 = 6;
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      lVar11 = pixels->_sizeY * uVar10;
      pRVar2 = pixels->_data;
      this = (half *)((long)pRVar2 + lVar7 + lVar11 + -6);
      fVar13 = (float)(int)uVar8 - fVar3;
      fVar14 = SQRT(fVar13 * fVar13 + __y * __y);
      if ((fVar12 < fVar14) || (fVar14 < 25.46479)) {
        Imath_3_2::half::operator=(this,0.5);
        uVar1 = this->_h;
        *(uint16_t *)((long)pRVar2 + lVar7 + -4 + lVar11) = uVar1;
        *(uint16_t *)((long)pRVar2 + lVar7 + -2 + lVar11) = uVar1;
        *(uint16_t *)((long)&(pRVar2->r)._h + lVar7 + lVar11) = uVar1;
      }
      else {
        fVar13 = atan2f(__y,fVar13);
        fVar13 = sinf(fVar13 * 40.0 + fVar14 * 0.5);
        fVar13 = fVar13 * 0.5 + 0.5;
        Imath_3_2::half::operator=(this,fVar13 * 0.5 + 0.5);
        uVar1 = this->_h;
        *(uint16_t *)((long)pRVar2 + lVar7 + -4 + lVar11) = uVar1;
        *(uint16_t *)((long)pRVar2 + lVar7 + -2 + lVar11) = uVar1;
        Imath_3_2::half::operator=
                  ((half *)((long)&(pRVar2->r)._h + lVar7 + lVar11),fVar13 * -0.5 + 0.5);
      }
      lVar7 = lVar7 + 8;
    }
    uVar10 = uVar10 + 8;
  }
  return;
}

Assistant:

void
wheel (Array2D<Rgba>& pixels, int w, int h)
{
    float n      = 40;
    float m      = 0.5;
    float radMin = 2 * n / M_PI;
    float xCen   = w * 0.5;
    float yCen   = h * 0.5;
    float radMax = (xCen < yCen) ? xCen : yCen;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];
            float rad =
                sqrt ((x - xCen) * (x - xCen) + (y - yCen) * (y - yCen));

            if (rad <= radMax && rad >= radMin)
            {
                float phi = atan2 (y - yCen, x - xCen);
                float c   = 0.5 + 0.5 * sin (phi * n + rad * m);

                p.r = 0.5 + 0.5 * c;
                p.g = p.r;
                p.b = p.r;
                p.a = 0.5 - 0.5 * c;
            }
            else
            {
                p.r = 0.5;
                p.g = p.r;
                p.b = p.r;
                p.a = p.r;
            }
        }
    }
}